

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void * __thiscall
icu_63::TimeZoneNamesImpl::ZoneStringsLoader::createKey
          (ZoneStringsLoader *this,char *key,UErrorCode *status)

{
  int iVar1;
  size_t sVar2;
  char *newKey;
  int32_t len;
  UErrorCode *status_local;
  char *key_local;
  ZoneStringsLoader *this_local;
  
  sVar2 = strlen(key);
  iVar1 = (int)sVar2 + 1;
  this_local = (ZoneStringsLoader *)uprv_malloc_63((long)iVar1);
  if (this_local == (ZoneStringsLoader *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    this_local = (ZoneStringsLoader *)0x0;
  }
  else {
    memcpy(this_local,key,(long)iVar1);
    *(undefined1 *)
     ((long)&(this_local->super_ResourceSink).super_UObject._vptr_UObject + (long)(int)sVar2) = 0;
  }
  return this_local;
}

Assistant:

void* createKey(const char* key, UErrorCode& status) {
        int32_t len = sizeof(char) * (static_cast<int32_t>(uprv_strlen(key)) + 1);
        char* newKey = (char*) uprv_malloc(len);
        if (newKey == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
        uprv_memcpy(newKey, key, len);
        newKey[len-1] = '\0';
        return (void*) newKey;
    }